

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkUifNodePairs(Wlc_Ntk_t *p,Vec_Int_t *vPairsInit)

{
  Wlc_Obj_t *pObj2;
  undefined1 *puVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *__ptr;
  Vec_Int_t *vFanins;
  int *piVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  ulong uVar9;
  Wlc_Ntk_t *pWVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  Wlc_Obj_t *pWVar15;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar16;
  long lVar17;
  long lVar18;
  
  __ptr = vPairsInit;
  if (vPairsInit == (Vec_Int_t *)0x0) {
    __ptr = Wlc_NtkFindUifableMultiplierPairs(p);
  }
  if (__ptr == (Vec_Int_t *)0x0) {
    return (Wlc_Ntk_t *)0x0;
  }
  if ((__ptr->nSize < 1) || ((__ptr->nSize & 1U) != 0)) {
    __assert_fail("Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                  ,0xfa,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  piVar7 = (int *)malloc(400);
  vFanins->pArray = piVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_01->pArray = piVar7;
  if (1 < __ptr->nSize) {
    lVar14 = 0;
    do {
      uVar6 = __ptr->pArray[lVar14];
      lVar18 = (long)(int)uVar6;
      if ((lVar18 < 1) || (p->nObjsAlloc <= (int)uVar6)) goto LAB_0037b519;
      uVar2 = __ptr->pArray[lVar14 + 1];
      if (((int)uVar2 < 1) || (p->nObjsAlloc <= (int)uVar2)) goto LAB_0037b519;
      pWVar15 = p->pObjs + lVar18;
      pObj2 = p->pObjs + uVar2;
      iVar4 = Wlc_NtkPairIsUifable(p,pWVar15,pObj2);
      if (iVar4 == 0) {
        __assert_fail("Wlc_NtkPairIsUifable(p, pObj, pObj2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x104,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      p_00->nSize = 0;
      uVar9 = (ulong)pWVar15->nFanins;
      if (0 < (int)pWVar15->nFanins) {
        lVar17 = 0;
        do {
          if (((uint)uVar9 < 3) &&
             ((undefined1  [24])((undefined1  [24])*pWVar15 & (undefined1  [24])0x2f) !=
              (undefined1  [24])0x6)) {
            paVar16 = &pWVar15->field_10;
          }
          else {
            paVar16 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar15->field_10).pFanins[0];
          }
          if ((2 < pObj2->nFanins) ||
             (paVar8 = &pObj2->field_10,
             (undefined1  [24])((undefined1  [24])*pObj2 & (undefined1  [24])0x2f) ==
             (undefined1  [24])0x6)) {
            paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj2->field_10).pFanins[0];
          }
          iVar4 = paVar16->Fanins[lVar17];
          iVar5 = paVar8->Fanins[lVar17];
          if (vFanins->nCap < 2) {
            if (vFanins->pArray == (int *)0x0) {
              piVar7 = (int *)malloc(8);
            }
            else {
              piVar7 = (int *)realloc(vFanins->pArray,8);
            }
            vFanins->pArray = piVar7;
            if (piVar7 == (int *)0x0) goto LAB_0037b538;
            vFanins->nCap = 2;
          }
          piVar7 = vFanins->pArray;
          lVar11 = 0;
          do {
            iVar12 = iVar5;
            if (lVar11 == 0) {
              iVar12 = iVar4;
            }
            piVar7[lVar11] = iVar12;
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          vFanins->nSize = 2;
          iVar4 = Wlc_ObjCreate(p,0x20,0,0,0,vFanins);
          Vec_IntPush(p_00,iVar4);
          if (p->nObjsAlloc <= (int)uVar6) goto LAB_0037b519;
          pWVar15 = p->pObjs + lVar18;
          lVar17 = lVar17 + 1;
          uVar9 = (ulong)(int)pWVar15->nFanins;
        } while (lVar17 < (long)uVar9);
      }
      iVar4 = Wlc_ObjCreate(p,0x17,0,p_00->nSize + -1,0,p_00);
      if (vFanins->nCap < 1) {
        if (vFanins->pArray == (int *)0x0) {
          piVar7 = (int *)malloc(4);
        }
        else {
          piVar7 = (int *)realloc(vFanins->pArray,4);
        }
        vFanins->pArray = piVar7;
        if (piVar7 == (int *)0x0) goto LAB_0037b538;
        vFanins->nCap = 1;
      }
      *vFanins->pArray = iVar4;
      vFanins->nSize = 1;
      iVar4 = Wlc_ObjCreate(p,0x26,0,0,0,vFanins);
      if (vFanins->nCap < 2) {
        if (vFanins->pArray == (int *)0x0) {
          piVar7 = (int *)malloc(8);
        }
        else {
          piVar7 = (int *)realloc(vFanins->pArray,8);
        }
        vFanins->pArray = piVar7;
        if (piVar7 == (int *)0x0) goto LAB_0037b538;
        vFanins->nCap = 2;
      }
      piVar7 = vFanins->pArray;
      lVar18 = 0;
      do {
        uVar13 = uVar6;
        if (lVar18 != 0) {
          uVar13 = uVar2;
        }
        piVar7[lVar18] = uVar13;
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      vFanins->nSize = 2;
      iVar5 = Wlc_ObjCreate(p,0x1f,0,0,0,vFanins);
      if (vFanins->nCap < 2) {
        if (vFanins->pArray == (int *)0x0) {
          piVar7 = (int *)malloc(8);
        }
        else {
          piVar7 = (int *)realloc(vFanins->pArray,8);
        }
        vFanins->pArray = piVar7;
        if (piVar7 == (int *)0x0) goto LAB_0037b538;
        vFanins->nCap = 2;
      }
      piVar7 = vFanins->pArray;
      lVar18 = 0;
      do {
        iVar12 = iVar5;
        if (lVar18 == 0) {
          iVar12 = iVar4;
        }
        piVar7[lVar18] = iVar12;
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      vFanins->nSize = 2;
      iVar4 = Wlc_ObjCreate(p,0x1d,0,0,0,vFanins);
      Vec_IntPush(p_01,iVar4);
      lVar14 = lVar14 + 2;
    } while ((int)((uint)lVar14 | 1) < __ptr->nSize);
  }
  iVar4 = p_01->nSize;
  if (iVar4 < 1) {
    __assert_fail("Vec_IntSize(vUifConstrs) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                  ,0x120,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  if (iVar4 == 1) {
    uVar6 = *p_01->pArray;
  }
  else {
    iVar4 = Wlc_ObjCreate(p,0x17,0,iVar4 + -1,0,p_01);
    if (vFanins->nCap < 1) {
      if (vFanins->pArray == (int *)0x0) {
        piVar7 = (int *)malloc(4);
      }
      else {
        piVar7 = (int *)realloc(vFanins->pArray,4);
      }
      vFanins->pArray = piVar7;
      if (piVar7 == (int *)0x0) {
LAB_0037b538:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vFanins->nCap = 1;
    }
    *vFanins->pArray = iVar4;
    vFanins->nSize = 1;
    uVar6 = Wlc_ObjCreate(p,0x25,0,0,0,vFanins);
  }
  if (0 < (p->vPos).nSize) {
    lVar14 = 0;
    do {
      uVar2 = (p->vPos).pArray[lVar14];
      if (((long)(int)uVar2 < 1) || (p->nObjsAlloc <= (int)uVar2)) {
LAB_0037b519:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (vFanins->nCap < 2) {
        if (vFanins->pArray == (int *)0x0) {
          piVar7 = (int *)malloc(8);
        }
        else {
          piVar7 = (int *)realloc(vFanins->pArray,8);
        }
        vFanins->pArray = piVar7;
        if (piVar7 == (int *)0x0) goto LAB_0037b538;
        vFanins->nCap = 2;
      }
      piVar7 = vFanins->pArray;
      lVar18 = 0;
      do {
        uVar13 = uVar6;
        if (lVar18 == 0) {
          uVar13 = uVar2;
        }
        piVar7[lVar18] = uVar13;
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      vFanins->nSize = 2;
      uVar6 = Wlc_ObjCreate(p,0x1c,0,0,0,vFanins);
      if (p->nObjsAlloc <= (int)uVar2) goto LAB_0037b519;
      if ((p->vPos).nSize <= lVar14) {
LAB_0037b557:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = (p->vPos).pArray;
      if (piVar7[lVar14] != uVar2) {
        __assert_fail("Vec_IntEntry(&p->vPos, i) == iObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x135,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      if ((p->vCos).nSize <= lVar14) goto LAB_0037b557;
      piVar3 = (p->vCos).pArray;
      if (piVar3[lVar14] != uVar2) {
        __assert_fail("Vec_IntEntry(&p->vCos, i) == iObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x136,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      pWVar15 = p->pObjs;
      piVar7[lVar14] = uVar6;
      if ((p->vCos).nSize <= lVar14) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar3[lVar14] = uVar6;
      if (((int)uVar6 < 1) || (p->nObjsAlloc <= (int)uVar6)) goto LAB_0037b519;
      puVar1 = &pWVar15[uVar6].field_0x1;
      *puVar1 = *puVar1 | 2;
      pWVar15 = pWVar15 + (int)uVar2;
      uVar2 = *(uint *)pWVar15;
      if ((uVar2 >> 9 & 1) == 0) {
        __assert_fail("pObj->fIsPo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x13b,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      *(ushort *)pWVar15 = (ushort)uVar2 & 0xfdff;
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vPos).nSize);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vFanins->pArray != (int *)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (int *)0x0;
  }
  if (vFanins != (Vec_Int_t *)0x0) {
    free(vFanins);
  }
  if (__ptr != vPairsInit) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
  }
  pWVar10 = Wlc_NtkDupDfs(p,0,1);
  return pWVar10;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkUifNodePairs( Wlc_Ntk_t * p, Vec_Int_t * vPairsInit )
{
    Vec_Int_t * vPairs = vPairsInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObj2;
    Vec_Int_t * vUifConstrs, * vCompares, * vFanins;
    int i, k, iObj, iObj2, iObjNew, iObjNew2;
    int iFanin, iFanin2, iFaninNew;
    // get multiplier pairs if not given
    if ( vPairs == NULL )
        vPairs = Wlc_NtkFindUifableMultiplierPairs( p );
    if ( vPairs == NULL )
        return NULL;
    // sanity checks
    assert( Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0 );
    // iterate through node pairs
    vFanins = Vec_IntAlloc( 100 );
    vCompares = Vec_IntAlloc( 100 );
    vUifConstrs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, iObj2, i )
    {
        // get two nodes
        pObj  = Wlc_NtkObj( p, iObj );
        pObj2 = Wlc_NtkObj( p, iObj2 );
        assert( Wlc_NtkPairIsUifable(p, pObj, pObj2) );
        // create fanin comparator nodes
        Vec_IntClear( vCompares );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            iFanin2 = Wlc_ObjFaninId( pObj2, k );
            Vec_IntFillTwo( vFanins, 2, iFanin, iFanin2 );
            iFaninNew = Wlc_ObjCreate( p, WLC_OBJ_COMP_NOTEQU, 0, 0, 0, vFanins );
            Vec_IntPush( vCompares, iFaninNew );
            // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
            // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
            pObj = Wlc_NtkObj( p, iObj );
        }
        // concatenate fanin comparators
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vCompares) - 1, 0, vCompares );
        // create reduction-OR node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_OR, 0, 0, 0, vFanins );
        // craete output comparator node
        Vec_IntFillTwo( vFanins, 2, iObj, iObj2 );
        iObjNew2 = Wlc_ObjCreate( p, WLC_OBJ_COMP_EQU, 0, 0, 0, vFanins );
        // create implication node (iObjNew is already complemented above)
        Vec_IntFillTwo( vFanins, 2, iObjNew, iObjNew2 );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_OR, 0, 0, 0, vFanins );
        // save the constraint
        Vec_IntPush( vUifConstrs, iObjNew );
    }
    // derive the AND of the UIF contraints
    assert( Vec_IntSize(vUifConstrs) > 0 );
    if ( Vec_IntSize(vUifConstrs) == 1 )
        iObjNew = Vec_IntEntry( vUifConstrs, 0 );
    else
    {
        // concatenate
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vUifConstrs) - 1, 0, vUifConstrs );
        // create reduction-AND node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_AND, 0, 0, 0, vFanins );
    }
    // update each PO to point to the new node
    Wlc_NtkForEachPo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Vec_IntFillTwo( vFanins, 2, iObj, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_AND, 0, 0, 0, vFanins );
        // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
        // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
        pObj = Wlc_NtkObj( p, iObj );
        // update PO/CO arrays
        assert( Vec_IntEntry(&p->vPos, i) == iObj );
        assert( Vec_IntEntry(&p->vCos, i) == iObj );
        Vec_IntWriteEntry( &p->vPos, i, iObjNew );
        Vec_IntWriteEntry( &p->vCos, i, iObjNew );
        // transfer the PO attribute
        Wlc_NtkObj(p, iObjNew)->fIsPo = 1;
        assert( pObj->fIsPo );
        pObj->fIsPo = 0;
    }
    // cleanup
    Vec_IntFree( vUifConstrs );
    Vec_IntFree( vCompares );
    Vec_IntFree( vFanins );
    if ( vPairs != vPairsInit )
        Vec_IntFree( vPairs );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}